

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<double,_QVariant>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<double,_QVariant>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<double,_QVariant>_> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  pair<double,_QVariant> *ppVar3;
  undefined1 *puVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  pair<double,_QVariant> *ppVar9;
  pair<double,_QVariant> *data;
  pair<double,_QVariant> *ppVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<double,_QVariant>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0 && where == GrowsAtEnd) &&
       (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::reallocate
                ((QMovableArrayOps<std::pair<double,_QVariant>_> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (pair<double,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    ppVar3 = local_48.ptr;
    if (local_48.ptr == (pair<double,_QVariant> *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar8 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar8) {
            ppVar10 = this->ptr;
            ppVar9 = ppVar10 + lVar8;
            do {
              ppVar3[local_48.size].first = ppVar10->first;
              ::QVariant::QVariant(&ppVar3[local_48.size].second,&ppVar10->second);
              local_48.size = local_48.size + 1;
              ppVar10 = ppVar10 + 1;
            } while (ppVar10 < ppVar9);
          }
        }
        else if (0 < lVar8) {
          ppVar9 = this->ptr;
          ppVar3 = ppVar9 + lVar8;
          do {
            local_48.ptr[local_48.size].first = ppVar9->first;
            pPVar5 = (ppVar9->second).d.data.shared;
            uVar6 = *(undefined8 *)((long)&(ppVar9->second).d.data + 8);
            uVar7 = *(undefined8 *)&(ppVar9->second).d.field_0x18;
            puVar1 = (undefined8 *)((long)&local_48.ptr[local_48.size].second.d.data + 0x10);
            *puVar1 = *(undefined8 *)((long)&(ppVar9->second).d.data + 0x10);
            puVar1[1] = uVar7;
            local_48.ptr[local_48.size].second.d.data.shared = pPVar5;
            *(undefined8 *)((long)&local_48.ptr[local_48.size].second.d.data + 8) = uVar6;
            (ppVar9->second).d.data.shared = (PrivateShared *)0x0;
            *(undefined8 *)((long)&(ppVar9->second).d.data + 8) = 0;
            *(undefined8 *)((long)&(ppVar9->second).d.data + 0x10) = 0;
            *(undefined8 *)&(ppVar9->second).d.field_0x18 = 2;
            ppVar9 = ppVar9 + 1;
            local_48.size = local_48.size + 1;
          } while (ppVar9 < ppVar3);
        }
      }
      pDVar2 = this->d;
      ppVar3 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar4 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = ppVar3;
      local_48.size = (qsizetype)puVar4;
      if (old != (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = ppVar3;
        local_48.size = old->size;
        old->size = (qsizetype)puVar4;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }